

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.cxx
# Opt level: O0

cmCTestTestHandler * __thiscall
cmCTestMemCheckCommand::InitializeActualHandler(cmCTestMemCheckCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmCTestMemCheckHandler *local_18;
  cmCTestMemCheckHandler *handler;
  cmCTestMemCheckCommand *this_local;
  
  handler = (cmCTestMemCheckHandler *)this;
  local_18 = cmCTest::GetMemCheckHandler
                       ((this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.
                        super_cmCTestCommand.CTest);
  (*(local_18->super_cmCTestTestHandler).super_cmCTestGenericHandler._vptr_cmCTestGenericHandler[3])
            ();
  pcVar1 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_MEMORYCHECK_TYPE",&local_39);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"MemoryCheckType",&local_38,
             (bool)((this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet & 1));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CTEST_MEMORYCHECK_SANITIZER_OPTIONS",&local_71);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"MemoryCheckSanitizerOptions",&local_70,
             (bool)((this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet & 1));
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pcVar1 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CTEST_MEMORYCHECK_COMMAND",&local_99);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"MemoryCheckCommand",&local_98,
             (bool)((this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet & 1));
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pcVar1 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CTEST_MEMORYCHECK_COMMAND_OPTIONS",&local_c1);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"MemoryCheckCommandOptions",&local_c0,
             (bool)((this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet & 1));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pcVar1 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CTEST_MEMORYCHECK_SUPPRESSIONS_FILE",&local_e9);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"MemoryCheckSuppressionFile",&local_e8,
             (bool)((this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet & 1));
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  cmCTestGenericHandler::SetQuiet
            ((cmCTestGenericHandler *)local_18,
             (bool)((this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet & 1));
  return &local_18->super_cmCTestTestHandler;
}

Assistant:

cmCTestTestHandler* cmCTestMemCheckCommand::InitializeActualHandler()
{
  cmCTestMemCheckHandler* handler = this->CTest->GetMemCheckHandler();
  handler->Initialize();

  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "MemoryCheckType", "CTEST_MEMORYCHECK_TYPE", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "MemoryCheckSanitizerOptions",
    "CTEST_MEMORYCHECK_SANITIZER_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "MemoryCheckCommand", "CTEST_MEMORYCHECK_COMMAND",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "MemoryCheckCommandOptions",
    "CTEST_MEMORYCHECK_COMMAND_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "MemoryCheckSuppressionFile",
    "CTEST_MEMORYCHECK_SUPPRESSIONS_FILE", this->Quiet);

  handler->SetQuiet(this->Quiet);
  return handler;
}